

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_constant.cpp
# Opt level: O2

bool duckdb::Transformer::ConstructConstantFromExpression(ParsedExpression *expr,Value *value)

{
  string *__lhs;
  ExpressionType EVar1;
  pointer puVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  FunctionExpression *pFVar6;
  pointer pPVar7;
  type pPVar8;
  ConstantExpression *pCVar9;
  CastExpression *pCVar10;
  const_reference pvVar11;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *pvVar12;
  LogicalType *pLVar13;
  LogicalType *value_type;
  BinderException *this;
  ConversionException *this_00;
  Value *child_value_2;
  pointer puVar14;
  __ireturn_type _Var15;
  Value child_value;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique_names;
  child_list_t<Value> values;
  vector<duckdb::Value,_true> keys_unpacked;
  vector<duckdb::Value,_true> local_180;
  vector<duckdb::Value,_true> local_168;
  vector<duckdb::Value,_true> values_unpacked;
  LogicalType local_138;
  vector<duckdb::Value,_true> local_120;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_108;
  LogicalType local_f0;
  LogicalType local_d8;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  LogicalType local_60;
  LogicalType local_48;
  
  EVar1 = (expr->super_BaseExpression).type;
  if (EVar1 == OPERATOR_CAST) {
    pCVar10 = BaseExpression::Cast<duckdb::CastExpression>(&expr->super_BaseExpression);
    LogicalType::LogicalType(&local_f0,SQLNULL);
    Value::Value(&child_value,&local_f0);
    LogicalType::~LogicalType(&local_f0);
    pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(&pCVar10->child);
    bVar4 = ConstructConstantFromExpression(pPVar8,&child_value);
    if (bVar4) {
      unique_names._M_h._M_buckets = &unique_names._M_h._M_before_begin._M_nxt;
      unique_names._M_h._M_bucket_count = 0;
      unique_names._M_h._M_before_begin._M_nxt =
           unique_names._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
      bVar5 = Value::DefaultTryCastAs
                        (&child_value,&pCVar10->cast_type,value,(string *)&unique_names,false);
      if (!bVar5) {
        this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&values,"Unable to cast %s to %s",(allocator *)&keys_unpacked);
        Value::ToString_abi_cxx11_(&local_a0,&child_value);
        EnumUtil::ToString<duckdb::LogicalTypeId>(&local_c0,(pCVar10->cast_type).id_);
        ConversionException::ConversionException<std::__cxx11::string,std::__cxx11::string>
                  (this_00,(string *)&values,&local_a0,&local_c0);
        __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::~string((string *)&unique_names);
    }
LAB_01352234:
    Value::~Value(&child_value);
  }
  else {
    if (EVar1 == VALUE_CONSTANT) {
      pCVar9 = BaseExpression::Cast<duckdb::ConstantExpression>(&expr->super_BaseExpression);
      Value::operator=(value,&pCVar9->value);
      return true;
    }
    if (EVar1 == FUNCTION) {
      pFVar6 = BaseExpression::Cast<duckdb::FunctionExpression>(&expr->super_BaseExpression);
      __lhs = &pFVar6->function_name;
      bVar4 = ::std::operator==(__lhs,"struct_pack");
      if (bVar4) {
        unique_names._M_h._M_buckets = &unique_names._M_h._M_single_bucket;
        unique_names._M_h._M_bucket_count = 1;
        unique_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        unique_names._M_h._M_element_count = 0;
        unique_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        unique_names._M_h._M_rehash_policy._M_next_resize = 0;
        unique_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
        values.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        values.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        values.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::reserve(&values.
                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                  ,(long)(pFVar6->children).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pFVar6->children).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        puVar14 = (pFVar6->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (pFVar6->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          bVar4 = puVar14 == puVar2;
          if (bVar4) {
            local_108.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 values.
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 .
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_108.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 values.
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 .
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_108.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 values.
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 .
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            values.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            values.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            values.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            Value::STRUCT(&child_value,(child_list_t<Value> *)&local_108);
            Value::operator=(value,&child_value);
            Value::~Value(&child_value);
            ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            ::~vector(&local_108);
LAB_01352541:
            ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            ::~vector(&values.
                       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                     );
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(&unique_names._M_h);
            return bVar4;
          }
          pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(puVar14);
          _Var15 = ::std::__detail::
                   _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)&unique_names,&(pPVar7->super_BaseExpression).alias);
          if (((undefined1  [16])_Var15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            this = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&child_value,"Duplicate struct entry name \"%s\"",
                       (allocator *)&keys_unpacked);
            pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->(puVar14);
            ::std::__cxx11::string::string
                      ((string *)&local_80,(string *)&(pPVar7->super_BaseExpression).alias);
            BinderException::BinderException<std::__cxx11::string>
                      (this,(string *)&child_value,&local_80);
            __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          LogicalType::LogicalType(&local_48,SQLNULL);
          Value::Value(&child_value,&local_48);
          LogicalType::~LogicalType(&local_48);
          pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator*(puVar14);
          bVar5 = ConstructConstantFromExpression(pPVar8,&child_value);
          if (!bVar5) {
            Value::~Value(&child_value);
            goto LAB_01352541;
          }
          pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(puVar14);
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
          ::emplace_back<std::__cxx11::string_const&,duckdb::Value>
                    ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                      *)&values,&(pPVar7->super_BaseExpression).alias,&child_value);
          Value::~Value(&child_value);
          puVar14 = puVar14 + 1;
        } while( true );
      }
      bVar4 = ::std::operator==(__lhs,"list_value");
      if (bVar4) {
        unique_names._M_h._M_buckets = (__buckets_ptr)0x0;
        unique_names._M_h._M_bucket_count = 0;
        unique_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::reserve
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&unique_names,
                   (long)(pFVar6->children).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pFVar6->children).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        puVar14 = (pFVar6->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (pFVar6->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          bVar4 = puVar14 == puVar2;
          if (bVar4) {
            LogicalType::LogicalType((LogicalType *)&values,SQLNULL);
            sVar3 = unique_names._M_h._M_bucket_count;
            for (pLVar13 = (LogicalType *)unique_names._M_h._M_buckets;
                pLVar13 != (LogicalType *)sVar3;
                pLVar13 = (LogicalType *)
                          &pLVar13[2].type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount) {
              LogicalType::ForceMaxLogicalType(&child_value.type_,(LogicalType *)&values,pLVar13);
              LogicalType::operator=((LogicalType *)&values,&child_value.type_);
              LogicalType::~LogicalType(&child_value.type_);
            }
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_120,
                       (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&unique_names);
            Value::LIST(&child_value,(LogicalType *)&values,&local_120);
            Value::operator=(value,&child_value);
            Value::~Value(&child_value);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_120);
            LogicalType::~LogicalType((LogicalType *)&values);
LAB_0135261c:
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&unique_names);
            return bVar4;
          }
          LogicalType::LogicalType(&local_60,SQLNULL);
          Value::Value(&child_value,&local_60);
          LogicalType::~LogicalType(&local_60);
          pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator*(puVar14);
          bVar5 = ConstructConstantFromExpression(pPVar8,&child_value);
          if (!bVar5) {
            Value::~Value(&child_value);
            goto LAB_0135261c;
          }
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&unique_names,
                     &child_value);
          Value::~Value(&child_value);
          puVar14 = puVar14 + 1;
        } while( true );
      }
      bVar4 = ::std::operator==(__lhs,"map");
      if (bVar4) {
        LogicalType::LogicalType(&local_d8,SQLNULL);
        Value::Value(&child_value,&local_d8);
        LogicalType::~LogicalType(&local_d8);
        pvVar11 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(&pFVar6->children,0);
        pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator*(pvVar11);
        bVar4 = ConstructConstantFromExpression(pPVar8,&child_value);
        if (bVar4) {
          LogicalType::LogicalType(&local_138,SQLNULL);
          Value::Value((Value *)&unique_names,&local_138);
          LogicalType::~LogicalType(&local_138);
          pvVar11 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::get<true>(&pFVar6->children,1);
          pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator*(pvVar11);
          bVar4 = ConstructConstantFromExpression(pPVar8,(Value *)&unique_names);
          if (bVar4) {
            pvVar12 = &ListValue::GetChildren(&child_value)->
                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&keys_unpacked,
                       pvVar12);
            pvVar12 = &ListValue::GetChildren((Value *)&unique_names)->
                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values_unpacked,
                       pvVar12);
            pLVar13 = ListType::GetChildType(&child_value.type_);
            value_type = ListType::GetChildType((LogicalType *)&unique_names);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_168,
                       &keys_unpacked.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_180,
                       &values_unpacked.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
            ;
            Value::MAP((Value *)&values,pLVar13,value_type,&local_168,&local_180);
            Value::operator=(value,(Value *)&values);
            Value::~Value((Value *)&values);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_180);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_168);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values_unpacked);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&keys_unpacked);
          }
          Value::~Value((Value *)&unique_names);
        }
        else {
          bVar4 = false;
        }
        goto LAB_01352234;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Transformer::ConstructConstantFromExpression(const ParsedExpression &expr, Value &value) {
	// We have to construct it like this because we don't have the ClientContext for binding/executing the expr here
	switch (expr.GetExpressionType()) {
	case ExpressionType::FUNCTION: {
		auto &function = expr.Cast<FunctionExpression>();
		if (function.function_name == "struct_pack") {
			unordered_set<string> unique_names;
			child_list_t<Value> values;
			values.reserve(function.children.size());
			for (const auto &child : function.children) {
				if (!unique_names.insert(child->GetAlias()).second) {
					throw BinderException("Duplicate struct entry name \"%s\"", child->GetAlias());
				}
				Value child_value;
				if (!ConstructConstantFromExpression(*child, child_value)) {
					return false;
				}
				values.emplace_back(child->GetAlias(), std::move(child_value));
			}
			value = Value::STRUCT(std::move(values));
			return true;
		} else if (function.function_name == "list_value") {
			vector<Value> values;
			values.reserve(function.children.size());
			for (const auto &child : function.children) {
				Value child_value;
				if (!ConstructConstantFromExpression(*child, child_value)) {
					return false;
				}
				values.emplace_back(std::move(child_value));
			}

			// figure out child type
			LogicalType child_type(LogicalTypeId::SQLNULL);
			for (auto &child_value : values) {
				child_type = LogicalType::ForceMaxLogicalType(child_type, child_value.type());
			}

			// finally create the list
			value = Value::LIST(child_type, values);
			return true;
		} else if (function.function_name == "map") {
			Value keys;
			if (!ConstructConstantFromExpression(*function.children[0], keys)) {
				return false;
			}

			Value values;
			if (!ConstructConstantFromExpression(*function.children[1], values)) {
				return false;
			}

			vector<Value> keys_unpacked = ListValue::GetChildren(keys);
			vector<Value> values_unpacked = ListValue::GetChildren(values);

			value = Value::MAP(ListType::GetChildType(keys.type()), ListType::GetChildType(values.type()),
			                   keys_unpacked, values_unpacked);
			return true;
		} else {
			return false;
		}
	}
	case ExpressionType::VALUE_CONSTANT: {
		auto &constant = expr.Cast<ConstantExpression>();
		value = constant.value;
		return true;
	}
	case ExpressionType::OPERATOR_CAST: {
		auto &cast = expr.Cast<CastExpression>();
		Value dummy_value;
		if (!ConstructConstantFromExpression(*cast.child, dummy_value)) {
			return false;
		}

		string error_message;
		if (!dummy_value.DefaultTryCastAs(cast.cast_type, value, &error_message)) {
			throw ConversionException("Unable to cast %s to %s", dummy_value.ToString(),
			                          EnumUtil::ToString(cast.cast_type.id()));
		}
		return true;
	}
	default:
		return false;
	}
}